

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O1

void __thiscall
Assimp::FBX::MeshGeometry::MeshGeometry
          (MeshGeometry *this,uint64_t id,Element *element,string *name,Document *doc)

{
  MatIndexArray *__s;
  pointer *ppaVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_02;
  pointer *ppuVar2;
  uint uVar3;
  uint uVar4;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
  *this_03;
  iterator __position;
  iterator __position_00;
  pointer puVar5;
  float fVar6;
  Document *pDVar7;
  int iVar8;
  long lVar9;
  uint *puVar10;
  Scope *layer;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
  _Var11;
  uint uVar12;
  aiVector3t<float> *__args;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
  pVar17;
  uint count;
  vector<int,_std::allocator<int>_> tempFaces;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tempVerts;
  char *err;
  uint local_f4;
  string local_f0;
  allocator local_c9;
  vector<int,_std::allocator<int>_> local_c8;
  Element *local_b0;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_a8;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_88;
  vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *local_80;
  Element *local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_70;
  Element *local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_58;
  _Rb_tree_node_base *local_50;
  MatIndexArray *local_48;
  Document *local_40;
  char *local_38;
  
  local_b0 = element;
  local_40 = doc;
  Geometry::Geometry(&this->super_Geometry,id,element,name,doc);
  (this->super_Geometry).super_Object._vptr_Object = (_func_int **)&PTR__MeshGeometry_0095d020;
  __s = &this->m_materials;
  local_80 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&this->m_vertices;
  local_88 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&this->m_faces;
  memset(__s,0,0xa8);
  lVar9 = 0x110;
  do {
    *(long *)((long)this + lVar9 + -0x10) =
         (long)&(this->super_Geometry).super_Object._vptr_Object + lVar9;
    *(undefined8 *)((long)this + lVar9 + -8) = 0;
    *(undefined1 *)((long)&(this->super_Geometry).super_Object._vptr_Object + lVar9) = 0;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0x210);
  memset(this->m_uvs,0,0xc0);
  memset(this->m_colors,0,0xc0);
  this_00 = &this->m_mapping_counts;
  this_01 = &this->m_mapping_offsets;
  this_02 = &this->m_mappings;
  (this->m_mapping_counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_mapping_counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_mapping_counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_mapping_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_mapping_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_mapping_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_mappings).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_mappings).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_mappings).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_03 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
             *)(local_b0->compound)._M_t.
               super___uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>.
               _M_t.
               super__Tuple_impl<0UL,_Assimp::FBX::Scope_*,_std::default_delete<Assimp::FBX::Scope>_>
               .super__Head_base<0UL,_Assimp::FBX::Scope_*,_false>._M_head_impl;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_70 = this_00;
  local_60 = this_02;
  local_58 = this_01;
  local_48 = __s;
  if (this_03 !=
      (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
       *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Vertices","");
    local_78 = GetRequiredElement((Scope *)this_03,&local_f0,local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"PolygonVertexIndex","");
    local_68 = GetRequiredElement((Scope *)this_03,&local_f0,local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Layer","");
    pVar17 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
             ::equal_range(this_03,&local_f0);
    local_50 = (_Rb_tree_node_base *)pVar17.second._M_node;
    _Var11 = pVar17.first._M_node;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    local_a8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ParseVectorDataArray(&local_a8,local_78);
    if (local_a8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_a8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      LogFunctions<Assimp::FBXImporter>::LogWarn((char *)0x60be46);
    }
    local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    ParseVectorDataArray(&local_c8,local_68);
    if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      LogFunctions<Assimp::FBXImporter>::LogWarn((char *)0x60be7e);
    }
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_80,
               (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,
               (ulong)((long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2) / 3);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (this_01,((long)local_a8.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_a8.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555)
    ;
    local_f0._M_dataplus._M_p = local_f0._M_dataplus._M_p & 0xffffffff00000000;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (this_00,((long)local_a8.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_a8.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555,
               (value_type_conflict3 *)&local_f0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (this_02,(long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2);
    local_f4 = 0;
    local_78 = (Element *)
               local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      uVar14 = ((long)local_a8.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_a8.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
      puVar10 = (uint *)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
      do {
        uVar12 = *puVar10;
        uVar16 = (ulong)(int)((int)uVar12 >> 0x1f ^ uVar12);
        if (uVar14 < uVar16 || uVar14 - uVar16 == 0) {
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f0,"polygon vertex index out of range","");
          Util::DOMError(&local_f0,local_68);
        }
        __args = local_a8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar16;
        __position._M_current =
             (this->m_vertices).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_vertices).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          _M_realloc_insert<aiVector3t<float>const&>(local_80,__position,__args);
        }
        else {
          (__position._M_current)->z = __args->z;
          fVar6 = __args->y;
          (__position._M_current)->x = __args->x;
          (__position._M_current)->y = fVar6;
          ppaVar1 = &(this->m_vertices).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        local_f4 = local_f4 + 1;
        puVar5 = (local_70->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_start + uVar16;
        *puVar5 = *puVar5 + 1;
        if ((int)uVar12 < 0) {
          __position_00._M_current =
               (this->m_faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position_00._M_current ==
              (this->m_faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>(local_88,__position_00,&local_f4);
          }
          else {
            *__position_00._M_current = local_f4;
            ppuVar2 = &(this->m_faces).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppuVar2 = *ppuVar2 + 1;
          }
          local_f4 = 0;
        }
        puVar10 = puVar10 + 1;
      } while ((Element *)puVar10 != local_78);
    }
    pDVar7 = local_40;
    if ((long)local_a8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_a8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar9 = ((long)local_a8.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_a8.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
      uVar12 = 0;
      lVar13 = 0;
      do {
        (local_58->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar13] = uVar12;
        puVar5 = (local_70->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        uVar12 = uVar12 + puVar5[lVar13];
        puVar5[lVar13] = 0;
        lVar13 = lVar13 + 1;
      } while (lVar9 + (ulong)(lVar9 == 0) != lVar13);
    }
    if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      uVar12 = 0;
      puVar10 = (uint *)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
      do {
        uVar15 = (int)*puVar10 >> 0x1f ^ *puVar10;
        puVar5 = (local_70->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        uVar3 = puVar5[(int)uVar15];
        uVar4 = (local_58->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start[(int)uVar15];
        puVar5[(int)uVar15] = uVar3 + 1;
        (local_60->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar3 + uVar4] = uVar12;
        uVar12 = uVar12 + 1;
        puVar10 = puVar10 + 1;
      } while (puVar10 !=
               (uint *)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    }
    if (_Var11._M_node != local_50) {
      do {
        iVar8 = ParseTokenAsInt((Token *)**(undefined8 **)(*(long *)(_Var11._M_node + 2) + 8),
                                &local_38);
        if (local_38 != (char *)0x0) {
          std::__cxx11::string::string((string *)&local_f0,local_38,&local_c9);
          Util::DOMError(&local_f0,local_b0);
        }
        if ((iVar8 == 0) || (pDVar7->settings->readAllLayers != false)) {
          layer = GetRequiredScope(*(Element **)(_Var11._M_node + 2));
          ReadLayer(this,layer);
        }
        else {
          LogFunctions<Assimp::FBXImporter>::LogWarn((char *)0x60c117);
        }
        _Var11._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var11._M_node);
      } while (_Var11._M_node != local_50);
    }
    if ((uint *)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (uint *)0x0) {
      operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_a8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,"failed to read Geometry object (class: Mesh), no data scope found"
             ,"");
  Util::DOMError(&local_f0,(Element *)0x0);
}

Assistant:

MeshGeometry::MeshGeometry(uint64_t id, const Element& element, const std::string& name, const Document& doc)
: Geometry(id, element,name, doc)
{
    const Scope* sc = element.Compound();
    if (!sc) {
        DOMError("failed to read Geometry object (class: Mesh), no data scope found");
    }

    // must have Mesh elements:
    const Element& Vertices = GetRequiredElement(*sc,"Vertices",&element);
    const Element& PolygonVertexIndex = GetRequiredElement(*sc,"PolygonVertexIndex",&element);

    // optional Mesh elements:
    const ElementCollection& Layer = sc->GetCollection("Layer");

    std::vector<aiVector3D> tempVerts;
    ParseVectorDataArray(tempVerts,Vertices);

    if(tempVerts.empty()) {
        FBXImporter::LogWarn("encountered mesh with no vertices");
    }

    std::vector<int> tempFaces;
    ParseVectorDataArray(tempFaces,PolygonVertexIndex);

    if(tempFaces.empty()) {
        FBXImporter::LogWarn("encountered mesh with no faces");
    }

    m_vertices.reserve(tempFaces.size());
    m_faces.reserve(tempFaces.size() / 3);

    m_mapping_offsets.resize(tempVerts.size());
    m_mapping_counts.resize(tempVerts.size(),0);
    m_mappings.resize(tempFaces.size());

    const size_t vertex_count = tempVerts.size();

    // generate output vertices, computing an adjacency table to
    // preserve the mapping from fbx indices to *this* indexing.
    unsigned int count = 0;
    for(int index : tempFaces) {
        const int absi = index < 0 ? (-index - 1) : index;
        if(static_cast<size_t>(absi) >= vertex_count) {
            DOMError("polygon vertex index out of range",&PolygonVertexIndex);
        }

        m_vertices.push_back(tempVerts[absi]);
        ++count;

        ++m_mapping_counts[absi];

        if (index < 0) {
            m_faces.push_back(count);
            count = 0;
        }
    }

    unsigned int cursor = 0;
    for (size_t i = 0, e = tempVerts.size(); i < e; ++i) {
        m_mapping_offsets[i] = cursor;
        cursor += m_mapping_counts[i];

        m_mapping_counts[i] = 0;
    }

    cursor = 0;
    for(int index : tempFaces) {
        const int absi = index < 0 ? (-index - 1) : index;
        m_mappings[m_mapping_offsets[absi] + m_mapping_counts[absi]++] = cursor++;
    }

    // if settings.readAllLayers is true:
    //  * read all layers, try to load as many vertex channels as possible
    // if settings.readAllLayers is false:
    //  * read only the layer with index 0, but warn about any further layers
    for (ElementMap::const_iterator it = Layer.first; it != Layer.second; ++it) {
        const TokenList& tokens = (*it).second->Tokens();

        const char* err;
        const int index = ParseTokenAsInt(*tokens[0], err);
        if(err) {
            DOMError(err,&element);
        }

        if(doc.Settings().readAllLayers || index == 0) {
            const Scope& layer = GetRequiredScope(*(*it).second);
            ReadLayer(layer);
        }
        else {
            FBXImporter::LogWarn("ignoring additional geometry layers");
        }
    }
}